

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O0

bool __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FreeAllocation(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
              Allocation *object)

{
  Page *page_00;
  void *segment_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint length_00;
  BVIndex index_00;
  BVIndex BVar4;
  BYTE *buffer;
  undefined4 *puVar5;
  DWORD protectFlags;
  AutoCriticalSection local_60;
  AutoCriticalSection autoLock;
  void *pageAddress;
  char *localAddr;
  uint freeBitsCount;
  BVIndex index;
  uint length;
  size_t pageSize;
  void *segment;
  Page *page;
  Allocation *object_local;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  page_00 = (object->field_0).page;
  segment_00 = page_00->segment;
  length_00 = GetChunkSizeForBytes(this,object->size);
  index_00 = GetIndexInPage(this,page_00,object->address);
  BVar4 = BVUnitT<unsigned_long>::Count(&page_00->freeBitVector);
  bVar2 = Page::IsEmpty(page_00);
  if ((bVar2) ||
     (BVar3 = BVUnitT<unsigned_long>::TestAnyInRange(&page_00->freeBitVector,index_00,length_00),
     BVar3 != '\0')) {
    CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
    this_local._7_1_ = false;
  }
  else {
    if ((page_00->inFullList & 1U) != 0) {
      if ((DAT_01ec73ca & 1) != 0) {
        Output::Trace(CustomHeapPhase,
                      L"Recycling page 0x%p because address 0x%p of size %d was freed\n",
                      page_00->address,object->address,object->size);
      }
      if (object->size == 0x1000) {
        EnsureAllocationWriteable(this,object);
        buffer = (BYTE *)CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                         ::AllocLocal(this->codePageAllocators,object->address,object->size,
                                      page_00->segment);
        if (buffer == (BYTE *)0x0) {
          MemoryOperationLastError::RecordError(-0x7ff5e9db);
          return false;
        }
        FillDebugBreak(buffer,object->size);
        CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
        FreeLocal(this->codePageAllocators,(char *)buffer,page_00->segment);
        autoLock.cs = (CriticalSection *)page_00->address;
        DListBase<Memory::CustomHeap::Page,_RealCount>::RemoveElement<Memory::ArenaAllocator>
                  (this->fullPages + page_00->currentBucket,this->auxiliaryAllocator,page_00);
        this->totalAllocationSize = this->totalAllocationSize - 0x1000;
        ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (&this->auxiliaryAllocator->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,object,
                   0x38);
        AutoCriticalSection::AutoCriticalSection(&local_60,&this->codePageAllocators->cs);
        CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
        ReleasePages(this->codePageAllocators,autoLock.cs,1,segment_00);
        AutoCriticalSection::~AutoCriticalSection(&local_60);
        if ((DAT_01ec73ca & 1) != 0) {
          Output::Trace(CustomHeapPhase,L"FastPath: freeing page-sized object directly\n");
        }
        return true;
      }
      AddPageToBucket(this,page_00,page_00->currentBucket,true);
    }
    if (BVar4 == 0x40 - length_00) {
      EnsureAllocationWriteable(this,object);
      FreeAllocationHelper(this,object,index_00,length_00);
      bVar2 = Page::IsEmpty(page_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                           ,0x373,"(page->IsEmpty())","page->IsEmpty()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      DListBase<Memory::CustomHeap::Page,_RealCount>::RemoveElement<Memory::ArenaAllocator>
                (this->buckets + page_00->currentBucket,this->auxiliaryAllocator,page_00);
      this_local._7_1_ = false;
    }
    else {
      EnsureAllocationExecuteWriteable(this,object);
      FreeAllocationHelper(this,object,index_00,length_00);
      GlobalSecurityPolicy::IsCFGEnabled();
      CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
      ProtectPages(this->codePageAllocators,page_00->address,1,segment_00,0x20,0x40);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Heap<TAlloc, TPreReservedAlloc>::FreeAllocation(Allocation* object)
{
    Page* page = object->page;
    void* segment = page->segment;
    size_t pageSize =  AutoSystemInfo::PageSize;

    unsigned int length = GetChunkSizeForBytes(object->size);
    BVIndex index = GetIndexInPage(page, object->address);

    uint freeBitsCount = page->freeBitVector.Count();

    // Make sure that the section under interest or the whole page has not already been freed
    if (page->IsEmpty() || page->freeBitVector.TestAnyInRange(index, length))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }

    if (page->inFullList)
    {
        VerboseHeapTrace(_u("Recycling page 0x%p because address 0x%p of size %d was freed\n"), page->address, object->address, object->size);
       
        // If the object being freed is equal to the page size, we're
        // going to remove it anyway so don't add it to a bucket
        if (object->size != pageSize)
        {
            AddPageToBucket(page, page->currentBucket, true);
        }
        else
        {
            EnsureAllocationWriteable(object);

            // Fill the old buffer with debug breaks
            char* localAddr = this->codePageAllocators->AllocLocal(object->address, object->size, page->segment);
            if (!localAddr)
            {
                MemoryOperationLastError::RecordError(JSERR_FatalMemoryExhaustion);
                return false;
            }
            FillDebugBreak((BYTE*)localAddr, object->size);
            this->codePageAllocators->FreeLocal(localAddr, page->segment);

            void* pageAddress = page->address;

            this->fullPages[page->currentBucket].RemoveElement(this->auxiliaryAllocator, page);            

            // The page is not in any bucket- just update the stats, free the allocation
            // and dump the page- we don't need to update free object size since the object
            // size is equal to the page size so they cancel each other out
#if DBG_DUMP
            this->totalAllocationSize -= pageSize;
#endif
            this->auxiliaryAllocator->Free(object, sizeof(Allocation));
            {
                AutoCriticalSection autoLock(&this->codePageAllocators->cs);
                this->codePageAllocators->ReleasePages(pageAddress, 1, segment);
            }
            VerboseHeapTrace(_u("FastPath: freeing page-sized object directly\n"));
            return true;
        }
    }

    // If the page is about to become empty then we should not need
    // to set it to executable and we don't expect to restore the
    // previous protection settings.
    if (freeBitsCount == BVUnit::BitsPerWord - length)
    {
        EnsureAllocationWriteable(object);
        FreeAllocationHelper(object, index, length);
        Assert(page->IsEmpty());

        this->buckets[page->currentBucket].RemoveElement(this->auxiliaryAllocator, page);
        return false;
    }
    else
    {
        EnsureAllocationExecuteWriteable(object);
        FreeAllocationHelper(object, index, length);

        // after freeing part of the page, the page should be in PAGE_EXECUTE_READWRITE protection, and turning to PAGE_EXECUTE_READ (always with TARGETS_NO_UPDATE state)

        DWORD protectFlags = 0;

        if (GlobalSecurityPolicy::IsCFGEnabled())
        {
            protectFlags = PAGE_EXECUTE_RO_TARGETS_NO_UPDATE;
        }
        else
        {
            protectFlags = PAGE_EXECUTE_READ;
        }

        this->codePageAllocators->ProtectPages(page->address, 1, segment, protectFlags, PAGE_EXECUTE_READWRITE);

        return true;
    }
}